

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator_variableInitialisedUsingAConstant_Test::TestBody
          (Generator_variableInitialisedUsingAConstant_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  AssertHelper local_2c0 [8];
  Message local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator<char> local_289;
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_4;
  GeneratorProfilePtr profile;
  Message local_220 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator<char> local_1f1;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_3;
  Message local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator<char> local_169;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  GeneratorPtr generator;
  AnalyserModelPtr analyserModel;
  Message local_f0 [8];
  unsigned_long local_e8 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  AnalyserPtr analyser;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Generator_variableInitialisedUsingAConstant_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/variable_initialised_using_a_constant/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x71a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
  local_e8[1] = 0;
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_1.message_);
  local_e8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_d8,"size_t(0)","analyser->errorCount()",local_e8 + 1,local_e8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x720,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,local_f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_1.message_);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  peVar4 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_2.message_);
  libcellml::Generator::setModel((shared_ptr *)peVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"generator/variable_initialised_using_a_constant/model.h",&local_169);
  fileContents((string *)&local_148);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_2.message_);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_128,
             "fileContents(\"generator/variable_initialised_using_a_constant/model.h\")",
             "generator->interfaceCode()",&local_148,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x727,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"generator/variable_initialised_using_a_constant/model.c",&local_1f1);
  fileContents((string *)&local_1d0);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_2.message_);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b0,
             "fileContents(\"generator/variable_initialised_using_a_constant/model.c\")",
             "generator->implementationCode()",&local_1d0,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x728,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_220);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  libcellml::GeneratorProfile::create((int)&gtest_ar_4 + 8);
  peVar4 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_2.message_);
  libcellml::Generator::setProfile((shared_ptr *)peVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_288,"generator/variable_initialised_using_a_constant/model.py",&local_289);
  fileContents((string *)&local_268);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_2.message_);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_248,
             "fileContents(\"generator/variable_initialised_using_a_constant/model.py\")",
             "generator->implementationCode()",&local_268,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              (local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x72e,pcVar2);
    testing::internal::AssertHelper::operator=(local_2c0,local_2b8);
    testing::internal::AssertHelper::~AssertHelper(local_2c0);
    testing::Message::~Message(local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)&gtest_ar_4.message_);
  std::shared_ptr<libcellml::Generator>::~shared_ptr
            ((shared_ptr<libcellml::Generator> *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::AnalyserModel>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserModel> *)
             &generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr
            ((shared_ptr<libcellml::Analyser> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, variableInitialisedUsingAConstant)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/variable_initialised_using_a_constant/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    EXPECT_EQ(fileContents("generator/variable_initialised_using_a_constant/model.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/variable_initialised_using_a_constant/model.c"), generator->implementationCode());

    auto profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/variable_initialised_using_a_constant/model.py"), generator->implementationCode());
}